

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

int amqpvalue_get_sasl_outcome(AMQP_VALUE value,SASL_OUTCOME_HANDLE *sasl_outcome_handle)

{
  int iVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  SASL_OUTCOME_HANDLE pSVar4;
  AMQP_VALUE pAVar5;
  AMQP_VALUE value_00;
  uint32_t list_item_count;
  sasl_code code;
  uint local_3c;
  amqp_binary local_38;
  
  pSVar4 = (SASL_OUTCOME_HANDLE)malloc(8);
  if (pSVar4 == (SASL_OUTCOME_HANDLE)0x0) {
    *sasl_outcome_handle = (SASL_OUTCOME_HANDLE)0x0;
    iVar3 = 0x2d7d;
  }
  else {
    pSVar4->composite_value = (AMQP_VALUE)0x0;
    *sasl_outcome_handle = pSVar4;
    pAVar5 = amqpvalue_get_inplace_described_value(value);
    if (pAVar5 == (AMQP_VALUE)0x0) {
      sasl_outcome_destroy(*sasl_outcome_handle);
      iVar3 = 0x2d85;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAVar5,&local_3c);
      iVar3 = 0x2d8c;
      if (iVar1 == 0) {
        if (local_3c == 0) {
          iVar3 = 0x2db9;
        }
        else {
          value_00 = amqpvalue_get_list_item(pAVar5,0);
          if (value_00 == (AMQP_VALUE)0x0) {
            sasl_outcome_destroy(*sasl_outcome_handle);
            iVar3 = 0x2d9b;
          }
          else {
            AVar2 = amqpvalue_get_type(value_00);
            if (AVar2 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(value_00);
              sasl_outcome_destroy(*sasl_outcome_handle);
              iVar3 = 0x2da5;
            }
            else {
              iVar3 = amqpvalue_get_ubyte(value_00,(uchar *)&local_38);
              if (iVar3 == 0) {
                amqpvalue_destroy(value_00);
                if ((1 < local_3c) &&
                   (pAVar5 = amqpvalue_get_list_item(pAVar5,1), pAVar5 != (AMQP_VALUE)0x0)) {
                  AVar2 = amqpvalue_get_type(pAVar5);
                  if ((AVar2 != AMQP_TYPE_NULL) &&
                     (iVar3 = amqpvalue_get_binary(pAVar5,&local_38), iVar3 != 0)) {
                    amqpvalue_destroy(pAVar5);
                    sasl_outcome_destroy(*sasl_outcome_handle);
                    return 0x2dd1;
                  }
                  amqpvalue_destroy(pAVar5);
                }
                pAVar5 = amqpvalue_clone(value);
                pSVar4->composite_value = pAVar5;
                iVar3 = 0;
              }
              else {
                amqpvalue_destroy(value_00);
                sasl_outcome_destroy(*sasl_outcome_handle);
                iVar3 = 0x2daf;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int amqpvalue_get_sasl_outcome(AMQP_VALUE value, SASL_OUTCOME_HANDLE* sasl_outcome_handle)
{
    int result;
    SASL_OUTCOME_INSTANCE* sasl_outcome_instance = (SASL_OUTCOME_INSTANCE*)sasl_outcome_create_internal();
    *sasl_outcome_handle = sasl_outcome_instance;
    if (*sasl_outcome_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            sasl_outcome_destroy(*sasl_outcome_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* code */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                sasl_outcome_destroy(*sasl_outcome_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                sasl_outcome_destroy(*sasl_outcome_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                sasl_code code;
                                if (amqpvalue_get_sasl_code(item_value, &code) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    sasl_outcome_destroy(*sasl_outcome_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* additional-data */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                amqp_binary additional_data;
                                if (amqpvalue_get_binary(item_value, &additional_data) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    sasl_outcome_destroy(*sasl_outcome_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    sasl_outcome_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}